

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O0

void __thiscall
uuids::uuid_name_generator::process_characters<wchar_t,std::char_traits<wchar_t>>
          (uuid_name_generator *this,basic_string_view<wchar_t,_std::char_traits<wchar_t>_> str)

{
  value_type_conflict vVar1;
  const_iterator pvVar2;
  uint32_t c;
  const_iterator __end0;
  const_iterator __begin0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *__range2;
  uuid_name_generator *this_local;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (uuid_name_generator *)str._M_len;
  __end0 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  for (; __end0 != pvVar2; __end0 = __end0 + 1) {
    vVar1 = *__end0;
    detail::sha1::process_byte(&this->hasher,(uint8_t)vVar1);
    detail::sha1::process_byte(&this->hasher,(uint8_t)((uint)vVar1 >> 8));
    detail::sha1::process_byte(&this->hasher,(uint8_t)((uint)vVar1 >> 0x10));
    detail::sha1::process_byte(&this->hasher,(uint8_t)((uint)vVar1 >> 0x18));
  }
  return;
}

Assistant:

void process_characters(std::basic_string_view<CharT, Traits> const str)
      {
         for (uint32_t c : str)
         {
            hasher.process_byte(static_cast<uint8_t>(c & 0xFF));
            if constexpr (!std::is_same_v<CharT, char>)
            {
               hasher.process_byte(static_cast<uint8_t>((c >> 8) & 0xFF));
               hasher.process_byte(static_cast<uint8_t>((c >> 16) & 0xFF));
               hasher.process_byte(static_cast<uint8_t>((c >> 24) & 0xFF));
            }
         }
      }